

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

void BZ2_bzWriteClose64(int *bzerror,BZFILE *b,int abandon,uint *nbytes_in_lo32,uint *nbytes_in_hi32
                       ,uint *nbytes_out_lo32,uint *nbytes_out_hi32)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t __n;
  
  if (b == (BZFILE *)0x0) {
    if (bzerror != (int *)0x0) {
      *bzerror = 0;
    }
  }
  else if (*(char *)((long)b + 0x1394) == '\0') {
    if (bzerror != (int *)0x0) {
      *bzerror = -1;
    }
    *(undefined4 *)((long)b + 0x13e8) = 0xffffffff;
  }
  else {
    iVar1 = ferror(*b);
    if (iVar1 == 0) {
      if (nbytes_in_lo32 != (uint *)0x0) {
        *nbytes_in_lo32 = 0;
      }
      if (nbytes_in_hi32 != (uint *)0x0) {
        *nbytes_in_hi32 = 0;
      }
      if (nbytes_out_lo32 != (uint *)0x0) {
        *nbytes_out_lo32 = 0;
      }
      if (nbytes_out_hi32 != (uint *)0x0) {
        *nbytes_out_hi32 = 0;
      }
      if (abandon != 0) {
LAB_004c05e9:
        if (nbytes_in_lo32 != (uint *)0x0) {
          *nbytes_in_lo32 = *(uint *)((long)b + 0x13a4);
        }
        if (nbytes_in_hi32 != (uint *)0x0) {
          *nbytes_in_hi32 = *(uint *)((long)b + 0x13a8);
        }
        if (nbytes_out_lo32 != (uint *)0x0) {
          *nbytes_out_lo32 = *(uint *)((long)b + 0x13bc);
        }
        if (nbytes_out_hi32 != (uint *)0x0) {
          *nbytes_out_hi32 = *(uint *)((long)b + 0x13c0);
        }
        if (bzerror != (int *)0x0) {
          *bzerror = 0;
        }
        *(undefined4 *)((long)b + 0x13e8) = 0;
        BZ2_bzCompressEnd((bz_stream *)((long)b + 0x1398));
        free(b);
        return;
      }
      if (*(int *)((long)b + 0x13e8) == 0) {
        do {
          *(undefined4 *)((long)b + 0x13b8) = 5000;
          *(void **)((long)b + 0x13b0) = (void *)((long)b + 8);
          iVar1 = BZ2_bzCompress((bz_stream *)((long)b + 0x1398),2);
          if (iVar1 - 5U < 0xfffffffe) {
            if (bzerror != (int *)0x0) {
              *bzerror = iVar1;
            }
            *(int *)((long)b + 0x13e8) = iVar1;
            return;
          }
          if (((ulong)*(uint *)((long)b + 0x13b8) < 5000) &&
             ((__n = 5000 - (ulong)*(uint *)((long)b + 0x13b8),
              sVar3 = fwrite((void *)((long)b + 8),1,__n,*b), (int)__n != (int)sVar3 ||
              (iVar2 = ferror(*b), iVar2 != 0)))) goto LAB_004c052f;
        } while (iVar1 != 4);
      }
      __stream = *b;
      iVar1 = ferror(__stream);
      if (iVar1 != 0) goto LAB_004c05e9;
      fflush(__stream);
      iVar1 = ferror(*b);
      if (iVar1 == 0) goto LAB_004c05e9;
    }
LAB_004c052f:
    if (bzerror != (int *)0x0) {
      *bzerror = -6;
    }
    *(undefined4 *)((long)b + 0x13e8) = 0xfffffffa;
  }
  return;
}

Assistant:

void BZ_API(BZ2_bzWriteClose64)
                  ( int*          bzerror, 
                    BZFILE*       b, 
                    int           abandon,
                    unsigned int* nbytes_in_lo32,
                    unsigned int* nbytes_in_hi32,
                    unsigned int* nbytes_out_lo32,
                    unsigned int* nbytes_out_hi32 )
{
   Int32   n, n2, ret;
   bzFile* bzf = (bzFile*)b;

   if (bzf == NULL)
      { BZ_SETERR(BZ_OK); return; };
   if (!(bzf->writing))
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return; };
   if (ferror(bzf->handle))
      { BZ_SETERR(BZ_IO_ERROR); return; };

   if (nbytes_in_lo32 != NULL) *nbytes_in_lo32 = 0;
   if (nbytes_in_hi32 != NULL) *nbytes_in_hi32 = 0;
   if (nbytes_out_lo32 != NULL) *nbytes_out_lo32 = 0;
   if (nbytes_out_hi32 != NULL) *nbytes_out_hi32 = 0;

   if ((!abandon) && bzf->lastErr == BZ_OK) {
      while (True) {
         bzf->strm.avail_out = BZ_MAX_UNUSED;
         bzf->strm.next_out = bzf->buf;
         ret = BZ2_bzCompress ( &(bzf->strm), BZ_FINISH );
         if (ret != BZ_FINISH_OK && ret != BZ_STREAM_END)
            { BZ_SETERR(ret); return; };

         if (bzf->strm.avail_out < BZ_MAX_UNUSED) {
            n = BZ_MAX_UNUSED - bzf->strm.avail_out;
            n2 = fwrite ( (void*)(bzf->buf), sizeof(UChar), 
                          n, bzf->handle );
            if (n != n2 || ferror(bzf->handle))
               { BZ_SETERR(BZ_IO_ERROR); return; };
         }

         if (ret == BZ_STREAM_END) break;
      }
   }

   if ( !abandon && !ferror ( bzf->handle ) ) {
      fflush ( bzf->handle );
      if (ferror(bzf->handle))
         { BZ_SETERR(BZ_IO_ERROR); return; };
   }

   if (nbytes_in_lo32 != NULL)
      *nbytes_in_lo32 = bzf->strm.total_in_lo32;
   if (nbytes_in_hi32 != NULL)
      *nbytes_in_hi32 = bzf->strm.total_in_hi32;
   if (nbytes_out_lo32 != NULL)
      *nbytes_out_lo32 = bzf->strm.total_out_lo32;
   if (nbytes_out_hi32 != NULL)
      *nbytes_out_hi32 = bzf->strm.total_out_hi32;

   BZ_SETERR(BZ_OK);
   BZ2_bzCompressEnd ( &(bzf->strm) );
   free ( bzf );
}